

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

int ndiGetPSTATToolInfo(ndicapi *pol,int port,char *information)

{
  char (*local_30) [32];
  char *dp;
  char *information_local;
  int port_local;
  ndicapi *pol_local;
  
  if ((port < 0x31) || (0x33 < port)) {
    if ((port < 0x41) || (0x49 < port)) {
      return 3;
    }
    local_30 = pol->PstatPassiveBasic + (port + -0x41);
  }
  else {
    local_30 = pol->PstatBasic + (port + -0x31);
  }
  if (((*local_30)[0] == 'U') || ((*local_30)[0] == '\0')) {
    pol_local._4_4_ = 3;
  }
  else {
    strncpy(information,*local_30,0x1e);
    pol_local._4_4_ = 0;
  }
  return pol_local._4_4_;
}

Assistant:

ndicapiExport int ndiGetPSTATToolInfo(ndicapi* pol, int port, char information[30])
{
  char* dp;

  if (port >= '1' && port <= '3')
  {
    dp = pol->PstatBasic[port - '1'];
  }
  else if (port >= 'A' && port <= 'I')
  {
    dp = pol->PstatPassiveBasic[port - 'A'];
  }
  else
  {
    return NDI_UNOCCUPIED;
  }

  // the 'U' is for UNOCCUPIED
  if (*dp == 'U' || *dp == '\0')
  {
    return NDI_UNOCCUPIED;
  }

  strncpy(information, dp, 30);

  return NDI_OKAY;
}